

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Array<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  long lVar1;
  String *pSVar2;
  String *pSVar3;
  Array<kj::String> *pAVar4;
  int iVar5;
  int iVar6;
  __off64_t _Var7;
  DIR *__dirp;
  int *piVar8;
  dirent64 *pdVar9;
  size_t size;
  ulong uVar10;
  undefined4 extraout_var;
  char *__s2;
  size_t sVar11;
  RemoveConst<kj::String> *pRVar12;
  Vector<kj::String> entries;
  Fault f;
  Fault f_3;
  Vector<kj::String> local_78;
  String local_58;
  Fault local_40;
  Array<kj::String> *local_38;
  
  do {
    _Var7 = lseek64((this->fd).fd,0,0);
    if (-1 < _Var7) goto LAB_001ee30c;
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
LAB_001ee30c:
  do {
    iVar5 = dup((this->fd).fd);
    if (-1 < iVar5) goto LAB_001ee32d;
    iVar6 = _::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
LAB_001ee32d:
  local_38 = __return_storage_ptr__;
  __dirp = fdopendir(iVar5);
  if (__dirp == (DIR *)0x0) {
    close(iVar5);
    __errno_location();
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_78.builder.ptr = (String *)0x0;
  local_78.builder.pos = (String *)0x0;
  local_78.builder.endPtr = (String *)0x0;
  local_78.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  piVar8 = __errno_location();
  do {
    while( true ) {
      *piVar8 = 0;
      pdVar9 = readdir64(__dirp);
      pAVar4 = local_38;
      if (pdVar9 == (dirent64 *)0x0) {
        if (*piVar8 != 0) {
          local_40.exception = (Exception *)0x0;
          local_58.content.ptr = (char *)0x0;
          local_58.content.size_ = 0;
          _::Debug::Fault::init
                    (&local_40,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          _::Debug::Fault::fatal(&local_40);
        }
        pRVar12 = local_78.builder.pos;
        if (local_78.builder.pos != local_78.builder.endPtr) {
          Vector<kj::String>::setCapacity
                    (&local_78,
                     ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                     -0x5555555555555555);
          pRVar12 = local_78.builder.pos;
        }
        pSVar2 = local_78.builder.ptr;
        uVar10 = ((long)pRVar12 - (long)local_78.builder.ptr >> 3) * -0x5555555555555555;
        pAVar4->ptr = local_78.builder.ptr;
        pAVar4->size_ = uVar10;
        pAVar4->disposer = local_78.builder.disposer;
        local_78.builder.ptr = (String *)0x0;
        local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
        local_78.builder.endPtr = (String *)0x0;
        if (pRVar12 != pSVar2) {
          lVar1 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::__introsort_loop<kj::String*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pSVar2,pRVar12,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<kj::String*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar2,pRVar12)
          ;
          pSVar3 = local_78.builder.endPtr;
          pRVar12 = local_78.builder.pos;
          pSVar2 = local_78.builder.ptr;
          if (local_78.builder.ptr != (String *)0x0) {
            local_78.builder.ptr = (String *)0x0;
            local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
            local_78.builder.endPtr = (String *)0x0;
            (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
                      (local_78.builder.disposer,pSVar2,0x18,
                       ((long)pRVar12 - (long)pSVar2 >> 3) * -0x5555555555555555,
                       ((long)pSVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
                       ArrayDisposer::Dispose_<kj::String>::destruct);
          }
        }
        iVar5 = closedir(__dirp);
        return (Array<kj::String> *)CONCAT44(extraout_var,iVar5);
      }
      __s = pdVar9->d_name;
      size = strlen(__s);
      if (size != 2) break;
      __s2 = "..";
LAB_001ee3c1:
      iVar5 = bcmp(__s,__s2,size + 1);
      if (iVar5 != 0) goto LAB_001ee3e2;
    }
    if (size == 1) {
      __s2 = ".";
      goto LAB_001ee3c1;
    }
    if ((size < 8) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
LAB_001ee3e2:
      if (pdVar9->d_type == '\0') {
        heapString(&local_58,__s,size);
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar11 = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                   0x5555555555555556;
          if (local_78.builder.pos == local_78.builder.ptr) {
            sVar11 = 4;
          }
          Vector<kj::String>::setCapacity(&local_78,sVar11);
        }
      }
      else {
        heapString(&local_58,__s,size);
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar11 = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                   0x5555555555555556;
          if (local_78.builder.pos == local_78.builder.ptr) {
            sVar11 = 4;
          }
          Vector<kj::String>::setCapacity(&local_78,sVar11);
        }
      }
      ((local_78.builder.pos)->content).ptr = local_58.content.ptr;
      ((local_78.builder.pos)->content).size_ = local_58.content.size_;
      ((local_78.builder.pos)->content).disposer = local_58.content.disposer;
      local_78.builder.pos = local_78.builder.pos + 1;
    }
  } while( true );
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }